

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.hpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
ranges::detail::
print_rng_<std::ostream,ranges::subrange<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,(ranges::subrange_kind)1>const>
          (basic_ostream<char,_std::char_traits<char>_> *sout,
          subrange<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_(ranges::subrange_kind)1>
          *rng)

{
  bool bVar1;
  reference piVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *__lhs;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  _result_t<const_ranges::subrange<__gnu_cxx::__normal_iterator<int_*,_std::vector<int>_>_>_&> e;
  _result_t<const_ranges::subrange<__gnu_cxx::__normal_iterator<int_*,_std::vector<int>_>_>_&> it;
  subrange<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_(ranges::subrange_kind)1>
  *rng_local;
  basic_ostream<char,_std::char_traits<char>_> *sout_local;
  
  std::operator<<(sout,'[');
  e._M_current = (int *)_begin_::fn::
                        operator()<const_ranges::subrange<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_(ranges::subrange_kind)1>_&>
                                  ((fn *)&_::begin,rng);
  local_28._M_current =
       (int *)_end_::fn::
              operator()<const_ranges::subrange<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_(ranges::subrange_kind)1>_&>
                        ((fn *)&_::end,rng);
  bVar1 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>(&e,&local_28);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    while( true ) {
      piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&e);
      std::ostream::operator<<(sout,*piVar2);
      __lhs = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&e);
      bVar1 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>(__lhs,&local_28)
      ;
      if (bVar1) break;
      std::operator<<(sout,',');
    }
  }
  std::operator<<(sout,']');
  return sout;
}

Assistant:

Stream & print_rng_(Stream & sout, Rng & rng)
        {
            sout << '[';
            auto it = ranges::begin(rng);
            auto const e = ranges::end(rng);
            if(it != e)
            {
                for(;;)
                {
                    sout << *it;
                    if(++it == e)
                        break;
                    sout << ',';
                }
            }
            sout << ']';
            return sout;
        }